

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

int vector2_equals(vector2 *self,vector2 *vT)

{
  short sVar1;
  bool local_19;
  vector2 *vT_local;
  vector2 *self_local;
  
  sVar1 = scalar_equalsf((self->field_0).v[0],(vT->field_0).v[0]);
  local_19 = false;
  if (sVar1 != 0) {
    sVar1 = scalar_equalsf((self->field_0).v[1],(vT->field_0).v[1]);
    local_19 = sVar1 != 0;
  }
  return (int)local_19;
}

Assistant:

HYPAPI int vector2_equals(const struct vector2 *self, const struct vector2 *vT)
{
	return scalar_equals(self->x, vT->x) && scalar_equals(self->y, vT->y);
}